

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IfConversion::CanHoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  bool bVar1;
  bool bVar2;
  BasicBlock *a;
  DefUseManager *pDVar3;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  a = IRContext::get_instr_block((this->super_Pass).context_,inst);
  bVar2 = true;
  if (a != (BasicBlock *)0x0) {
    bVar1 = DominatorAnalysisBase::Dominates
                      (&dominators->super_DominatorAnalysisBase,a,target_block);
    if (!bVar1) {
      bVar2 = Instruction::IsOpcodeCodeMotionSafe(inst);
      if (bVar2) {
        pDVar3 = IRContext::get_def_use_mgr((this->super_Pass).context_);
        local_50._8_8_ = 0;
        local_50._M_unused._M_object = operator_new(0x20);
        *(IfConversion **)local_50._M_unused._0_8_ = this;
        *(BasicBlock **)((long)local_50._M_unused._0_8_ + 8) = target_block;
        *(DefUseManager **)((long)local_50._M_unused._0_8_ + 0x10) = pDVar3;
        *(DominatorAnalysis **)((long)local_50._M_unused._0_8_ + 0x18) = dominators;
        local_38 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:290:7)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:290:7)>
                   ::_M_manager;
        bVar2 = Instruction::WhileEachInId(inst,(function<bool_(unsigned_int_*)> *)&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool IfConversion::CanHoistInstruction(Instruction* inst,
                                       BasicBlock* target_block,
                                       DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return true;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return true;
  }

  if (!inst->IsOpcodeCodeMotionSafe()) {
    return false;
  }

  // Check all instruction |inst| depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  return inst->WhileEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        return CanHoistInstruction(operand_inst, target_block, dominators);
      });
}